

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O2

u8 read_u8(Emulator *e,Address addr)

{
  u8 uVar1;
  MemoryTypeAddressPair pair;
  Bool raw;
  
  dma_synchronize(e);
  if (((addr & 0xff00) == 0xfe00) && ((e->state).dma.state == DMA_ACTIVE)) {
    uVar1 = 0xff;
  }
  else {
    if ((short)addr < 0) {
      pair = map_address(addr);
      uVar1 = read_u8_pair(e,pair,raw);
      return uVar1;
    }
    uVar1 = e->cart_info->data[addr & 0x3fff | (e->state).memory_map_state.rom_base[addr >> 0xe]];
  }
  return uVar1;
}

Assistant:

static u8 read_u8(Emulator* e, Address addr) {
  dma_synchronize(e);
  if (UNLIKELY(!is_dma_access_ok(e, addr))) {
    HOOK(read_during_dma_a, addr);
    return INVALID_READ_BYTE;
  }
  if (LIKELY(addr < 0x8000)) {
    u32 bank = addr >> ROM_BANK_SHIFT;
    u32 rom_addr = MMAP_STATE.rom_base[bank] | (addr & ADDR_MASK_16K);
    u8 value = e->cart_info->data[rom_addr];
    HOOK(read_rom_ib, rom_addr, value);
    return value;
  } else {
    return read_u8_pair(e, map_address(addr), FALSE);
  }
}